

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_meta
                   (string *__return_storage_ptr__,MetaVariable *meta,uint32_t indent,
                   bool emit_type_name,string *varname)

{
  bool bVar1;
  ostream *poVar2;
  value_type *pvVar3;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_00;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 closing_brace;
  undefined1 auVar6 [16];
  allocator local_279;
  pprint *local_278;
  string *local_270;
  string name;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_248;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  pv;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  closing_brace = SUB81(varname,0);
  local_278 = (pprint *)CONCAT44(in_register_00000014,indent);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::string::string((string *)&name,(string *)&meta->_name);
  if (name._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&name);
    if (name._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&name);
    }
  }
  MetaVariable::
  get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
            (&local_248,meta);
  nonstd::optional_lite::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  ::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>,_0>
            (&pv,&local_248);
  nonstd::optional_lite::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  ::~optional(&local_248);
  if (pv.has_value_ == true) {
    local_270 = __return_storage_ptr__;
    bVar1 = isValidIdentifier(&name,true);
    n_00 = extraout_EDX;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_1d8,"\"",&local_279);
      quote((string *)&local_248,&name,&local_1d8);
      std::__cxx11::string::operator=((string *)&name,(string *)&local_248);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      n_00 = extraout_EDX_00;
    }
    iVar4 = (int)local_278;
    pprint::Indent_abi_cxx11_((string *)&local_248,(pprint *)((ulong)local_278 & 0xffffffff),n_00);
    poVar2 = std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = std::operator<<(poVar2,"dictionary ");
    poVar2 = std::operator<<(poVar2,(string *)&name);
    std::operator<<(poVar2," = {\n");
    std::__cxx11::string::_M_dispose();
    pvVar3 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value(&pv);
    auVar6._8_8_ = extraout_RDX;
    auVar6._0_8_ = (pvVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var5 = auVar6._0_8_,
          (_Rb_tree_header *)p_Var5 != &(pvVar3->_M_t)._M_impl.super__Rb_tree_header) {
      print_meta((string *)&local_248,(MetaVariable *)(p_Var5 + 2),iVar4 + 1,true,
                 (string *)(p_Var5 + 1));
      std::operator<<(local_1a8,(string *)&local_248);
      std::__cxx11::string::_M_dispose();
      auVar6 = std::_Rb_tree_increment(p_Var5);
    }
    pprint::Indent_abi_cxx11_((string *)&local_248,local_278,auVar6._8_4_);
    poVar2 = std::operator<<(local_1a8,(string *)&local_248);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::_M_dispose();
    __return_storage_ptr__ = local_270;
  }
  else {
    pprint::Indent_abi_cxx11_((string *)&local_248,local_278,n);
    std::operator<<(local_1a8,(string *)&local_248);
    std::__cxx11::string::_M_dispose();
    if (emit_type_name) {
      linb::any::type_name_abi_cxx11_((string *)&local_248,(any *)meta);
      poVar2 = std::operator<<(local_1a8,(string *)&local_248);
      std::operator<<(poVar2," ");
      std::__cxx11::string::_M_dispose();
    }
    poVar2 = std::operator<<(local_1a8,(string *)&name);
    poVar2 = std::operator<<(poVar2," = ");
    value::pprint_value_abi_cxx11_
              ((string *)&local_248,(value *)meta,(Value *)0x0,1,(bool)closing_brace);
    poVar2 = std::operator<<(poVar2,(string *)&local_248);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::_M_dispose();
  }
  nonstd::optional_lite::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  ::~optional(&pv);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_meta(const MetaVariable &meta, const uint32_t indent, bool emit_type_name,
                       const std::string &varname) {
  std::stringstream ss;

  // ss << "TODO: isObject " << meta.is_object() << ", isValue " <<
  // meta.IsValue() << "\n";

  // Use varname if meta.name is empty
  std::string name = meta.get_name();
  if (name.empty()) {
    name = varname;
  }

  if (name.empty()) {
    name = "[ERROR:EmptyName]";
  }

  if (auto pv = meta.get_value<CustomDataType>()) {
    // dict
    if (!isValidIdentifier(name)) {
      // May contain "/", quote it
      name = quote(name);
    }
    ss << pprint::Indent(indent) << "dictionary " << name << " = {\n";
    for (const auto &item : pv.value()) {
      ss << print_meta(item.second, indent + 1, /* emit_type_name */true, item.first);
    }
    ss << pprint::Indent(indent) << "}\n";
  } else {
    ss << pprint::Indent(indent);
    if (emit_type_name) {
      ss << meta.type_name() << " ";
    }
    ss << name << " = "
       << pprint_value(meta.get_raw_value()) << "\n";
  }

  return ss.str();
}